

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O1

void xercesc_4_0::XMLChar1_0::enableNELWS(void)

{
  if (enableNEL == '\0') {
    enableNEL = '\x01';
    s_HXHHH_XHHHHHMMXMMMMMMMMMMNHPHXHH_00425161[100] = DAT_0042514a;
    s_HXHHH_XHHHHHMMXMMMMMMMMMMNHPHXHH_00425161[0x2007] = DAT_0042514a;
  }
  return;
}

Assistant:

void XMLChar1_0::enableNELWS() {

    if (!enableNEL) {
        enableNEL = true;
        // When option is on, treat NEL same as LF
        fgCharCharsTable1_0[chNEL] = fgCharCharsTable1_0[chLF];

        // For simplicity, also treat 0x2028 same as LF
        fgCharCharsTable1_0[chLineSeparator] = fgCharCharsTable1_0[chLF];
    }
}